

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

char parseNibble(char hex)

{
  char hex_local;
  
  if ((hex & 0x40U) == 0) {
    hex_local = hex & 0xf;
  }
  else {
    hex_local = (hex & 0xdfU) - 0x37;
  }
  return hex_local;
}

Assistant:

char parseNibble(char hex) {
	hex &= ~0x20;
	if (hex & 0x40) {
		hex -= 'A' - 10;
	}
	else {
		hex &= 0xf;
	}
	return hex;
}